

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  WhereLevel *pWVar1;
  Op *pOVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  Parse *pParse;
  sqlite3 *db;
  Vdbe *v;
  SrcList *pSVar6;
  WhereRightJoin *pWVar7;
  WhereLoop *pWVar8;
  Schema *pSVar9;
  Table *pTVar10;
  Index *pIVar11;
  Index *pIVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  u8 uVar16;
  Schema **ppSVar17;
  anon_union_16_2_b76807be_for_u *paVar18;
  Op *pOVar19;
  IndexedExpr *pIVar20;
  uint uVar21;
  WhereRightJoin *pRJ;
  int op;
  long lVar22;
  int iVar23;
  ushort uVar24;
  ulong uVar25;
  u16 *puVar26;
  ulong uVar27;
  Index **ppIVar28;
  int iVar29;
  u8 *puVar30;
  WhereLevel *pLevel;
  
  pParse = pWInfo->pParse;
  db = pParse->db;
  v = pParse->pVdbe;
  if ((ulong)pWInfo->nLevel == 0) {
    cVar14 = '\0';
  }
  else {
    pSVar6 = pWInfo->pTabList;
    iVar4 = v->nOp;
    pLevel = pWInfo->a;
    cVar14 = '\0';
    uVar25 = (ulong)pWInfo->nLevel;
    do {
      pWVar1 = pLevel + (uVar25 - 1);
      pWVar7 = pWInfo->a[uVar25 - 1].pRJ;
      if (pWVar7 != (WhereRightJoin *)0x0) {
        sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        pWVar1->addrCont = 0;
        pWVar7->endSubrtn = v->nOp;
        sqlite3VdbeAddOp3(v,0x43,pWVar7->regReturn,pWVar7->addrSubrtn,1);
        cVar14 = cVar14 + '\x01';
      }
      pWVar8 = pWVar1->pWLoop;
      if (pWVar1->op == 0xb8) {
        if (pWVar1->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        }
      }
      else {
        iVar23 = 0;
        iVar29 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (iVar29 = iVar23, uVar25 == pWInfo->nLevel)) &&
            ((pWVar8->wsFlags & 0x200) != 0)) &&
           (pIVar11 = (pWVar8->u).btree.pIndex, (pIVar11->field_0x63 & 0x80) != 0)) {
          uVar24 = (pWVar8->u).btree.nDistinctCol;
          if ((uVar24 != 0) && (0x23 < pIVar11->aiRowLogEst[uVar24])) {
            iVar29 = pParse->nMem + 1;
            uVar21 = 0;
            do {
              sqlite3VdbeAddOp3(v,0x5e,pWVar1->iIdxCur,uVar21,iVar29 + uVar21);
              uVar21 = uVar21 + 1;
            } while (uVar24 != uVar21);
            pParse->nMem = pParse->nMem + (uint)uVar24 + 1;
            iVar29 = sqlite3VdbeAddOp3(v,(uint)(pWVar1->op != '&') * 3 + 0x15,pWVar1->iIdxCur,0,
                                       iVar29);
            if (v->db->mallocFailed == '\0') {
              pOVar19 = v->aOp;
              pOVar19[iVar29].p4type = -3;
              *(uint *)&pOVar19[iVar29].p4 = (uint)uVar24;
            }
            sqlite3VdbeAddOp3(v,9,1,pWVar1->p2,0);
          }
        }
        if (pWVar1->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrCont);
        }
        sqlite3VdbeAddOp3(v,(uint)pWVar1->op,pWVar1->p1,pWVar1->p2,(uint)pWVar1->p3);
        if (0 < (long)v->nOp) {
          v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar1->p5;
        }
        if (pWVar1->regBignull != 0) {
          sqlite3VdbeResolveLabel(v,pWVar1->addrBignull);
          sqlite3VdbeAddOp3(v,0x3d,pWVar1->regBignull,pWVar1->p2 + -1,0);
        }
        if (iVar29 != 0) {
          pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (v->db->mallocFailed == '\0') {
            pOVar19 = v->aOp + iVar29;
          }
          pOVar19->p2 = v->nOp;
        }
      }
      if (((pWVar8->wsFlags & 0x800) != 0) && (0 < (pWVar1->u).in.nIn)) {
        sqlite3VdbeResolveLabel(v,pWVar1->addrNxt);
        iVar29 = (pWVar1->u).in.nIn;
        if (0 < (long)iVar29) {
          iVar23 = v->nOp;
          uVar16 = v->db->mallocFailed;
          puVar30 = &(pWVar1->u).in.aInLoop[(long)iVar29 + -1].eEndLoopOp;
          iVar29 = iVar29 + 1;
          do {
            pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar16 == '\0') {
              pOVar19 = v->aOp + (long)*(int *)(puVar30 + -0xc) + 1;
            }
            pOVar19->p2 = iVar23;
            if (*puVar30 != 0xb8) {
              if (*(int *)(puVar30 + -4) != 0) {
                uVar21 = pWVar8->wsFlags & 0x40400;
                if (pWVar1->iLeftJoin != 0) {
                  sqlite3VdbeAddOp3(v,0x19,((InLoop *)(puVar30 + -0x10))->iCur,
                                    (uint)(uVar21 == 0x40000) + iVar23 + 2,0);
                }
                if (uVar21 == 0x40000) {
                  iVar23 = *(int *)(puVar30 + -4);
                  iVar15 = sqlite3VdbeAddOp3(v,0x1a,pWVar1->iIdxCur,v->nOp + 2,
                                             *(int *)(puVar30 + -8));
                  if (v->db->mallocFailed == '\0') {
                    pOVar19 = v->aOp;
                    pOVar19[iVar15].p4type = -3;
                    pOVar19[iVar15].p4.i = iVar23;
                    iVar23 = v->nOp;
                    if (v->db->mallocFailed != '\0') goto LAB_00199f91;
                    pOVar19 = v->aOp + (long)*(int *)(puVar30 + -0xc) + 1;
                  }
                  else {
                    iVar23 = v->nOp;
LAB_00199f91:
                    pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
                  }
                  pOVar19->p2 = iVar23;
                }
              }
              sqlite3VdbeAddOp3(v,(uint)*puVar30,((InLoop *)(puVar30 + -0x10))->iCur,
                                *(int *)(puVar30 + -0xc),0);
              iVar23 = v->nOp;
              uVar16 = v->db->mallocFailed;
            }
            pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar16 == '\0') {
              pOVar19 = v->aOp + (long)*(int *)(puVar30 + -0xc) + -1;
            }
            pOVar19->p2 = iVar23;
            puVar30 = puVar30 + -0x14;
            iVar29 = iVar29 + -1;
          } while (1 < iVar29);
        }
      }
      sqlite3VdbeResolveLabel(v,pWVar1->addrBrk);
      if (pWVar1->pRJ != (WhereRightJoin *)0x0) {
        sqlite3VdbeAddOp3(v,0x43,pWVar1->pRJ->regReturn,0,1);
      }
      if (pWVar1->addrSkip != 0) {
        sqlite3VdbeAddOp3(v,9,0,pWVar1->addrSkip,0);
        iVar29 = v->nOp;
        if (v->db->mallocFailed == '\0') {
          pOVar19 = v->aOp + (long)pWVar1->addrSkip + -2;
          v->aOp[pWVar1->addrSkip].p2 = iVar29;
        }
        else {
          pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_0021a438 = iVar29;
        }
        pOVar19->p2 = iVar29;
      }
      if (pWVar1->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(v,0x3d,pWVar1->iLikeRepCntr >> 1,pWVar1->addrLikeRep,0);
      }
      if (pWVar1->iLeftJoin != 0) {
        uVar21 = pWVar8->wsFlags;
        iVar29 = sqlite3VdbeAddOp3(v,0x3b,pWVar1->iLeftJoin,0,0);
        if ((uVar21 & 0x40) == 0) {
          sqlite3VdbeAddOp3(v,0x88,pWVar1->iTabCur,0,0);
        }
        if ((uVar21 >> 9 & 1) == 0) {
          if (((uVar21 >> 0xd & 1) != 0) && ((pWVar1->u).pCoveringIdx != (Index *)0x0)) {
LAB_0019a119:
            pIVar11 = (pWVar1->u).pCoveringIdx;
            if (pIVar11->pSchema == (Schema *)0x0) {
              iVar23 = -0x8000;
            }
            else {
              iVar23 = -1;
              ppSVar17 = &db->aDb->pSchema;
              do {
                iVar23 = iVar23 + 1;
                pSVar9 = *ppSVar17;
                ppSVar17 = ppSVar17 + 4;
              } while (pSVar9 != pIVar11->pSchema);
            }
            sqlite3VdbeAddOp3(v,0x65,pWVar1->iIdxCur,pIVar11->tnum,iVar23);
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar11);
            goto LAB_0019a177;
          }
        }
        else {
          if ((uVar21 >> 0xd & 1) != 0) goto LAB_0019a119;
LAB_0019a177:
          sqlite3VdbeAddOp3(v,0x88,pWVar1->iIdxCur,0,0);
        }
        if (pWVar1->op == 'C') {
          iVar23 = pWVar1->addrFirst;
          iVar15 = pWVar1->p1;
          op = 10;
        }
        else {
          iVar23 = pWVar1->addrFirst;
          op = 9;
          iVar15 = 0;
        }
        sqlite3VdbeAddOp3(v,op,iVar15,iVar23,0);
        pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (v->db->mallocFailed == '\0') {
          pOVar19 = v->aOp + iVar29;
        }
        pOVar19->p2 = v->nOp;
      }
      bVar13 = 1 < (long)uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar13);
    if (pWInfo->nLevel != '\0') {
      uVar21 = 0;
      do {
        if (pLevel->pRJ == (WhereRightJoin *)0x0) {
          bVar3 = pLevel->iFrom;
          if ((pSVar6->a[bVar3].fg.field_0x1 & 0x20) == 0) {
            pTVar10 = pSVar6->a[bVar3].pTab;
            uVar5 = pLevel->pWLoop->wsFlags;
            if ((uVar5 & 0x240) == 0) {
              if ((uVar5 >> 0xd & 1) == 0) goto LAB_0019a419;
              paVar18 = &pLevel->u;
            }
            else {
              paVar18 = (anon_union_16_2_b76807be_for_u *)&(pLevel->pWLoop->u).btree.pIndex;
            }
            pIVar11 = paVar18->pCoveringIdx;
            if ((pIVar11 != (Index *)0x0) && (db->mallocFailed == '\0')) {
              iVar29 = iVar4;
              if ((pWInfo->eOnePass != '\0') && ((pIVar11->pTable->tabFlags & 0x80) == 0)) {
                iVar29 = pWInfo->iEndWhere;
              }
              if (((pIVar11->field_0x64 & 8) != 0) &&
                 (pIVar20 = pParse->pIdxExpr, pIVar20 != (IndexedExpr *)0x0)) {
                iVar23 = pLevel->iIdxCur;
                do {
                  if (pIVar20->iIdxCur == iVar23) {
                    pIVar20->iDataCur = -1;
                    pIVar20->iIdxCur = -1;
                  }
                  pIVar20 = pIVar20->pIENext;
                } while (pIVar20 != (IndexedExpr *)0x0);
              }
              lVar22 = (long)pLevel->addrBody + 1;
              pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (v->db->mallocFailed == '\0') {
                pOVar19 = v->aOp + lVar22;
              }
              pOVar2 = pOVar19 + (iVar29 - (int)lVar22);
              iVar29 = pLevel->iTabCur;
              do {
                if (pOVar19->p1 == iVar29) {
                  uVar16 = pOVar19->opcode;
                  if (uVar16 == '\x14') {
LAB_0019a404:
                    pOVar19->p1 = pLevel->iIdxCur;
                  }
                  else if (uVar16 == 0x87) {
                    pOVar19->p1 = pLevel->iIdxCur;
                    pOVar19->opcode = 0x8e;
                  }
                  else if (uVar16 == '^') {
                    uVar25 = (ulong)pOVar19->p2;
                    ppIVar28 = &pTVar10->pIndex;
                    if ((char)pTVar10->tabFlags < '\0') {
                      do {
                        pIVar12 = *ppIVar28;
                        ppIVar28 = &pIVar12->pNext;
                      } while ((*(ushort *)&pIVar12->field_0x63 & 3) != 2);
                      uVar25 = (ulong)(ushort)pIVar12->aiColumn[uVar25];
                    }
                    else if ((-1 < (short)pOVar19->p2) && ((pTVar10->tabFlags & 0x20) != 0)) {
                      puVar26 = &pTVar10->aCol->colFlags;
                      lVar22 = -1;
                      do {
                        uVar24 = (short)uVar25 + (ushort)((*puVar26 >> 5 & 1) != 0);
                        uVar25 = (ulong)uVar24;
                        lVar22 = lVar22 + 1;
                        puVar26 = puVar26 + 8;
                      } while (lVar22 < (short)uVar24);
                    }
                    if ((ulong)pIVar11->nColumn != 0) {
                      uVar27 = 0;
                      do {
                        if (pIVar11->aiColumn[uVar27] == (short)uVar25) {
                          if (-1 < (short)uVar27) {
                            pOVar19->p2 = (uint)uVar27 & 0x7fff;
                            goto LAB_0019a404;
                          }
                          break;
                        }
                        uVar27 = uVar27 + 1;
                      } while (pIVar11->nColumn != uVar27);
                    }
                  }
                }
                pOVar19 = pOVar19 + 1;
              } while (pOVar19 < pOVar2);
            }
          }
          else {
            translateColumnToCopy
                      (pParse,pLevel->addrBody,pLevel->iTabCur,pSVar6->a[bVar3].regResult,0);
          }
        }
        else {
          sqlite3WhereRightJoinLoop(pWInfo,uVar21,pLevel);
        }
LAB_0019a419:
        uVar21 = uVar21 + 1;
        pLevel = pLevel + 1;
      } while (uVar21 < pWInfo->nLevel);
    }
  }
  sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn - cVar14;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxExpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else{
            /* Unable to translate the table reference into an index
            ** reference.  Verify that this is harmless - that the
            ** table being referenced really is open.
            */
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
            assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
                 || cursorIsOpen(v,pOp->p1,k)
                 || pOp->opcode==OP_Offset
            );
#else
            assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
                 || cursorIsOpen(v,pOp->p1,k)
            );
#endif
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}